

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crunch.cpp
# Opt level: O0

convert_status __thiscall
crunch::convert_file
          (crunch *this,uint32 file_index,uint32 num_files,char *pSrc_filename,char *pDst_filename,
          format out_file_type)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  dynamic_string *pdVar4;
  char *pcVar5;
  undefined1 local_590 [7];
  bool status;
  convert_stats stats;
  pixel_format trial_fmt;
  uint32 i;
  convert_params params;
  double total_time;
  undefined1 local_a0 [8];
  mipmapped_texture src_tex;
  undefined1 local_50 [4];
  format src_file_format;
  timer tim;
  format out_file_type_local;
  char *pDst_filename_local;
  char *pSrc_filename_local;
  uint32 num_files_local;
  uint32 file_index_local;
  crunch *this_local;
  
  tim._20_4_ = out_file_type;
  crnlib::timer::timer((timer *)local_50);
  if (num_files < 2) {
    crnlib::console::message("Reading source texture: \"%s\"",pSrc_filename);
  }
  else {
    crnlib::console::message
              ("[%u/%u] Reading source texture: \"%s\"",(ulong)(file_index + 1),(ulong)num_files);
  }
  src_tex.m_last_error.m_pStr._4_4_ =
       crnlib::texture_file_types::determine_file_format(pSrc_filename);
  if (src_tex.m_last_error.m_pStr._4_4_ == cFormatInvalid) {
    crnlib::console::error("Unrecognized file type: %s",pSrc_filename);
    this_local._4_4_ = cCSFailed;
  }
  else {
    crnlib::mipmapped_texture::mipmapped_texture((mipmapped_texture *)local_a0);
    crnlib::timer::start((timer *)local_50);
    bVar2 = crnlib::mipmapped_texture::read_from_file
                      ((mipmapped_texture *)local_a0,pSrc_filename,src_tex.m_last_error.m_pStr._4_4_
                      );
    if (bVar2) {
      params._1064_8_ = crnlib::timer::get_elapsed_secs((timer *)local_50);
      crnlib::console::info("Texture successfully loaded in %3.3fs",params._1064_8_);
      bVar2 = crnlib::command_line_params::get_value_as_bool
                        (&this->m_params,"converttoluma",0,false);
      if (bVar2) {
        crnlib::mipmapped_texture::convert((mipmapped_texture *)local_a0,cConversion_Y_To_RGB);
      }
      bVar2 = crnlib::command_line_params::get_value_as_bool
                        (&this->m_params,"setalphatoluma",0,false);
      if (bVar2) {
        crnlib::mipmapped_texture::convert((mipmapped_texture *)local_a0,cConversion_Y_To_A);
      }
      crnlib::texture_conversion::convert_params::convert_params((convert_params *)&trial_fmt);
      params.m_pInput_texture._0_4_ =
           crnlib::mipmapped_texture::determine_texture_type((mipmapped_texture *)local_a0);
      _trial_fmt = (mipmapped_texture *)local_a0;
      crnlib::dynamic_string::operator=((dynamic_string *)&params.m_texture_type,pDst_filename);
      params.m_dst_filename.m_pStr._0_4_ = tim._20_4_;
      params.m_y_flip = crnlib::command_line_params::has_key(&this->m_params,"lzmastats");
      params.m_error_message.m_pStr._3_1_ =
           crnlib::command_line_params::has_key(&this->m_params,"split");
      params.m_error_message.m_pStr._2_1_ =
           crnlib::command_line_params::has_key(&this->m_params,"usesourceformat");
      params.m_error_message.m_pStr._0_1_ =
           crnlib::command_line_params::has_key(&this->m_params,"yflip");
      params.m_error_message.m_pStr._1_1_ =
           crnlib::command_line_params::has_key(&this->m_params,"unflip");
      bVar2 = crnlib::command_line_params::get_value_as_bool(&this->m_params,"noprogress",0,false);
      if ((!bVar2) &&
         (bVar2 = crnlib::command_line_params::get_value_as_bool(&this->m_params,"quiet",0,false),
         !bVar2)) {
        params._1008_8_ = progress_callback_func;
      }
      bVar2 = crnlib::command_line_params::get_value_as_bool(&this->m_params,"debug",0,false);
      if (bVar2) {
        params.m_error_message.m_pStr._5_1_ = 1;
        crn_comp_params::set_flag
                  ((crn_comp_params *)&params.m_dst_file_type,cCRNCompFlagDebugging,true);
      }
      bVar2 = crnlib::command_line_params::get_value_as_bool(&this->m_params,"paramdebug",0,false);
      if (bVar2) {
        params.m_error_message.m_pStr._6_1_ = 1;
      }
      bVar2 = crnlib::command_line_params::get_value_as_bool(&this->m_params,"quick",0,false);
      if (bVar2) {
        params.m_error_message.m_pStr._4_1_ = 1;
      }
      params.m_error_message.m_pStr._7_1_ =
           crnlib::command_line_params::get_value_as_bool(&this->m_params,"nostats",0,false);
      params.m_dst_filename.m_pStr._4_4_ = PIXEL_FMT_INVALID;
      for (stats.m_output_comp_file_size._4_4_ = 0; uVar1 = stats.m_output_comp_file_size._4_4_,
          uVar3 = crnlib::pixel_format_helpers::get_num_formats(), uVar1 < uVar3;
          stats.m_output_comp_file_size._4_4_ = stats.m_output_comp_file_size._4_4_ + 1) {
        stats.m_output_comp_file_size._0_4_ =
             crnlib::pixel_format_helpers::get_pixel_format_by_index
                       (stats.m_output_comp_file_size._4_4_);
        pcVar5 = crnlib::pixel_format_helpers::get_pixel_format_string
                           ((pixel_format)stats.m_output_comp_file_size);
        bVar2 = crnlib::command_line_params::has_key(&this->m_params,pcVar5);
        if (bVar2) {
          params.m_dst_filename.m_pStr._4_4_ = (pixel_format)stats.m_output_comp_file_size;
          break;
        }
      }
      bVar2 = crnlib::texture_file_types::supports_mipmaps(src_tex.m_last_error.m_pStr._4_4_);
      if (bVar2) {
        params.m_comp_params.m_pProgress_func_data._4_4_ = 1;
      }
      bVar2 = parse_mipmap_params(this,(crn_mipmap_params *)
                                       &params.m_comp_params.m_pProgress_func_data);
      if (bVar2) {
        bVar2 = parse_comp_params(this,(format)params.m_dst_filename.m_pStr,
                                  (crn_comp_params *)&params.m_dst_file_type);
        if (bVar2) {
          bVar2 = parse_scale_params(this,(crn_mipmap_params *)
                                          &params.m_comp_params.m_pProgress_func_data);
          if (bVar2) {
            print_texture_info(this,"Source texture",(convert_params *)&trial_fmt,
                               (mipmapped_texture *)local_a0);
            if ((texture_type)params.m_pInput_texture == cTextureTypeNormalMap) {
              crn_comp_params::set_flag
                        ((crn_comp_params *)&params.m_dst_file_type,cCRNCompFlagPerceptual,false);
            }
            crnlib::texture_conversion::convert_stats::convert_stats((convert_stats *)local_590);
            crnlib::timer::start((timer *)local_50);
            bVar2 = crnlib::texture_conversion::process
                              ((convert_params *)&trial_fmt,(convert_stats *)local_590);
            params._1064_8_ = crnlib::timer::get_elapsed_secs((timer *)local_50);
            if (bVar2) {
              crnlib::console::info("Texture successfully processed in %3.3fs",params._1064_8_);
              bVar2 = crnlib::command_line_params::get_value_as_bool
                                (&this->m_params,"nostats",0,false);
              if (!bVar2) {
                print_stats(this,(convert_stats *)local_590,false);
              }
              this_local._4_4_ = cCSSucceeded;
            }
            else {
              bVar2 = crnlib::dynamic_string::is_empty
                                ((dynamic_string *)&params.m_pIntermediate_texture);
              if (bVar2) {
                crnlib::console::error("Failed writing output file: \"%s\"",pDst_filename);
              }
              else {
                pcVar5 = crnlib::dynamic_string::get_ptr
                                   ((dynamic_string *)&params.m_pIntermediate_texture);
                crnlib::console::error(pcVar5);
              }
              this_local._4_4_ = cCSFailed;
            }
            crnlib::texture_conversion::convert_stats::~convert_stats((convert_stats *)local_590);
          }
          else {
            this_local._4_4_ = cCSBadParam;
          }
        }
        else {
          this_local._4_4_ = cCSBadParam;
        }
      }
      else {
        this_local._4_4_ = cCSBadParam;
      }
      crnlib::texture_conversion::convert_params::~convert_params((convert_params *)&trial_fmt);
    }
    else {
      pdVar4 = crnlib::mipmapped_texture::get_last_error((mipmapped_texture *)local_a0);
      bVar2 = crnlib::dynamic_string::is_empty(pdVar4);
      if (bVar2) {
        crnlib::console::error("Failed reading source file: \"%s\"",pSrc_filename);
      }
      else {
        pdVar4 = crnlib::mipmapped_texture::get_last_error((mipmapped_texture *)local_a0);
        pcVar5 = crnlib::dynamic_string::get_ptr(pdVar4);
        crnlib::console::error("%s",pcVar5);
      }
      this_local._4_4_ = cCSFailed;
    }
    crnlib::mipmapped_texture::~mipmapped_texture((mipmapped_texture *)local_a0);
  }
  return this_local._4_4_;
}

Assistant:

convert_status convert_file(uint32 file_index, uint32 num_files, const char* pSrc_filename, const char* pDst_filename, texture_file_types::format out_file_type)
    {
        timer tim;

        if (num_files > 1)
        {
            console::message("[%u/%u] Reading source texture: \"%s\"", file_index + 1, num_files, pSrc_filename);
        }
        else
        {
            console::message("Reading source texture: \"%s\"", pSrc_filename);
        }

        texture_file_types::format src_file_format = texture_file_types::determine_file_format(pSrc_filename);
        if (src_file_format == texture_file_types::cFormatInvalid)
        {
            console::error("Unrecognized file type: %s", pSrc_filename);
            return cCSFailed;
        }

        mipmapped_texture src_tex;
        tim.start();
        if (!src_tex.read_from_file(pSrc_filename, src_file_format))
        {
            if (src_tex.get_last_error().is_empty())
            {
                console::error("Failed reading source file: \"%s\"", pSrc_filename);
            }
            else
            {
                console::error("%s", src_tex.get_last_error().get_ptr());
            }

            return cCSFailed;
        }
        double total_time = tim.get_elapsed_secs();
        console::info("Texture successfully loaded in %3.3fs", total_time);

        if (m_params.get_value_as_bool("converttoluma"))
        {
            src_tex.convert(image_utils::cConversion_Y_To_RGB);
        }
        if (m_params.get_value_as_bool("setalphatoluma"))
        {
            src_tex.convert(image_utils::cConversion_Y_To_A);
        }

        texture_conversion::convert_params params;

        params.m_texture_type = src_tex.determine_texture_type();
        params.m_pInput_texture = &src_tex;
        params.m_dst_filename = pDst_filename;
        params.m_dst_file_type = out_file_type;
        params.m_lzma_stats = m_params.has_key("lzmastats");
        params.m_write_mipmaps_to_multiple_files = m_params.has_key("split");
        params.m_always_use_source_pixel_format = m_params.has_key("usesourceformat");
        params.m_y_flip = m_params.has_key("yflip");
        params.m_unflip = m_params.has_key("unflip");

        if ((!m_params.get_value_as_bool("noprogress")) && (!m_params.get_value_as_bool("quiet")))
        {
            params.m_pProgress_func = progress_callback_func;
        }

        if (m_params.get_value_as_bool("debug"))
        {
            params.m_debugging = true;
            params.m_comp_params.set_flag(cCRNCompFlagDebugging, true);
        }

        if (m_params.get_value_as_bool("paramdebug"))
        {
            params.m_param_debugging = true;
        }

        if (m_params.get_value_as_bool("quick"))
        {
            params.m_quick = true;
        }

        params.m_no_stats = m_params.get_value_as_bool("nostats");

        params.m_dst_format = PIXEL_FMT_INVALID;

        for (uint32 i = 0; i < pixel_format_helpers::get_num_formats(); i++)
        {
            pixel_format trial_fmt = pixel_format_helpers::get_pixel_format_by_index(i);
            if (m_params.has_key(pixel_format_helpers::get_pixel_format_string(trial_fmt)))
            {
                params.m_dst_format = trial_fmt;
                break;
            }
        }

        if (texture_file_types::supports_mipmaps(src_file_format))
        {
            params.m_mipmap_params.m_mode = cCRNMipModeUseSourceMips;
        }

        if (!parse_mipmap_params(params.m_mipmap_params))
        {
            return cCSBadParam;
        }

        if (!parse_comp_params(params.m_dst_file_type, params.m_comp_params))
        {
            return cCSBadParam;
        }

        if (!parse_scale_params(params.m_mipmap_params))
        {
            return cCSBadParam;
        }

        print_texture_info("Source texture", params, src_tex);

        if (params.m_texture_type == cTextureTypeNormalMap)
        {
            params.m_comp_params.set_flag(cCRNCompFlagPerceptual, false);
        }

        texture_conversion::convert_stats stats;

        tim.start();
        bool status = texture_conversion::process(params, stats);
        total_time = tim.get_elapsed_secs();

        if (!status)
        {
            if (params.m_error_message.is_empty())
            {
                console::error("Failed writing output file: \"%s\"", pDst_filename);
            }
            else
            {
                console::error(params.m_error_message.get_ptr());
            }
            return cCSFailed;
        }

        console::info("Texture successfully processed in %3.3fs", total_time);

        if (!m_params.get_value_as_bool("nostats"))
        {
            print_stats(stats);
        }

        return cCSSucceeded;
    }